

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O2

void __thiscall unodb::qsbr_per_thread::qsbr_per_thread(qsbr_per_thread *this)

{
  qsbr_epoch qVar1;
  qsbr *this_00;
  undefined1 auVar2 [16];
  
  std::make_unique<unodb::detail::dealloc_vector_list_node>();
  std::make_unique<unodb::detail::dealloc_vector_list_node>();
  this->quiescent_states_since_epoch_change = 0;
  this_00 = qsbr::instance();
  qVar1 = qsbr::register_thread(this_00);
  (this->last_seen_quiescent_state_epoch).epoch_val = qVar1.epoch_val;
  (this->last_seen_epoch).epoch_val = qVar1.epoch_val;
  this->current_interval_total_dealloc_size = 0;
  (this->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->previous_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->current_interval_dealloc_requests).
  super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->previous_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)
   ((long)&(this->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined8 *)
   ((long)&(this->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->current_interval_dealloc_requests).
           super__Vector_base<unodb::detail::deallocation_request,_std::allocator<unodb::detail::deallocation_request>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->active_ptrs)._M_h._M_buckets = &(this->active_ptrs)._M_h._M_single_bucket;
  (this->active_ptrs)._M_h._M_bucket_count = 1;
  auVar2 = ZEXT416(0) << 0x40;
  (this->active_ptrs)._M_h._M_before_begin = (__node_base)auVar2._0_8_;
  (this->active_ptrs)._M_h._M_element_count = auVar2._8_8_;
  (this->active_ptrs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->active_ptrs)._M_h._M_rehash_policy._M_next_resize = auVar2;
  return;
}

Assistant:

inline qsbr_per_thread::qsbr_per_thread()
    : last_seen_quiescent_state_epoch{qsbr::instance().register_thread()},
      last_seen_epoch{last_seen_quiescent_state_epoch} {}